

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IterSetOutputsTokendata(Fts5Iter *pIter)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  void *pvVar4;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Fts5PoslistReader *pReader;
  i64 iMinPos;
  Fts5TokenDataMap *aNew;
  int nNew;
  Fts5Iter *p_1;
  int nByte;
  int nReader;
  int eDetail;
  Fts5Iter *p;
  Fts5TokenDataIter *pT;
  int iMin;
  i64 iRowid;
  int nHit;
  int ii;
  i64 iPrev;
  i64 *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  Fts5Buffer *pBuf;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  long *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iVar5;
  uint in_stack_ffffffffffffffb8;
  int iVar6;
  int iVar7;
  Fts5Index *in_stack_ffffffffffffffc0;
  int local_2c;
  Fts5Config *local_28;
  int local_20;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0;
  local_28 = (Fts5Config *)0x8000000000000000;
  piVar2 = (int *)in_RDI[3];
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[1] = 0;
  for (local_1c = 0; local_1c < piVar2[8]; local_1c = local_1c + 1) {
    in_stack_ffffffffffffffc0 = *(Fts5Index **)(piVar2 + (long)local_1c * 2 + 0xe);
    if (in_stack_ffffffffffffffc0->field_0x14 == '\0') {
      if ((local_20 == 0) || ((long)in_stack_ffffffffffffffc0->pConfig < (long)local_28)) {
        local_28 = in_stack_ffffffffffffffc0->pConfig;
        local_20 = 1;
        in_RDI[1] = in_stack_ffffffffffffffc0->zDataTbl;
        *(int *)(in_RDI + 2) = in_stack_ffffffffffffffc0->nWorkUnit;
      }
      else if (in_stack_ffffffffffffffc0->pConfig == local_28) {
        local_20 = local_20 + 1;
      }
    }
  }
  if (local_20 == 0) {
    *(undefined1 *)((long)in_RDI + 0x14) = 1;
  }
  else {
    iVar7 = *(int *)(*(long *)in_RDI[4] + 0x74);
    *(undefined1 *)((long)in_RDI + 0x14) = 0;
    *in_RDI = local_28;
    if ((local_20 == 1) && (iVar7 == 0)) {
      fts5TokendataIterAppendMap
                (in_stack_ffffffffffffffc0,(Fts5TokenDataIter *)(ulong)in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,(i64)in_stack_ffffffffffffffa8,
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    else if ((1 < local_20) && (iVar7 != 1)) {
      iVar6 = 0;
      iVar5 = 0;
      if (*(long *)(piVar2 + 10) == 0) {
        pvVar4 = sqlite3Fts5MallocZero
                           (in_stack_ffffffffffffff90,(sqlite3_int64)in_stack_ffffffffffffff88);
        *(void **)(piVar2 + 10) = pvVar4;
        if (*(long *)(piVar2 + 10) == 0) goto LAB_002701ba;
        *(long *)(piVar2 + 0xc) = *(long *)(piVar2 + 10) + (long)piVar2[8] * 0x20;
      }
      for (local_1c = 0; local_1c < piVar2[8]; local_1c = local_1c + 1) {
        in_stack_ffffffffffffffa8 = *(long **)(piVar2 + (long)local_1c * 2 + 0xe);
        if (local_28 == (Fts5Config *)*in_stack_ffffffffffffffa8) {
          *(int *)(*(long *)(piVar2 + 0xc) + (long)iVar6 * 4) = local_1c;
          iVar6 = iVar6 + 1;
          sqlite3Fts5PoslistReaderInit
                    ((u8 *)in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                     ,(Fts5PoslistReader *)0x26ff2e);
          iVar5 = (int)in_stack_ffffffffffffffa8[2] + iVar5;
        }
      }
      if (((uint)(*(int *)(in_RDI + 6) + iVar5 + local_20 * 10) <= *(uint *)((long)in_RDI + 0x34))
         || (iVar3 = sqlite3Fts5BufferSize
                               ((int *)in_stack_ffffffffffffffa8,
                                (Fts5Buffer *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (u32)((ulong)in_stack_ffffffffffffff98 >> 0x20)), iVar3 == 0)) {
        if ((iVar7 == 0) && (*piVar2 < piVar2[1] + iVar5)) {
          iVar5 = (*piVar2 + iVar5) * 2;
          pvVar4 = sqlite3_realloc(in_stack_ffffffffffffff88,0);
          if (pvVar4 == (void *)0x0) {
            *(undefined4 *)(in_RDI[4] + 0x3c) = 7;
            goto LAB_002701ba;
          }
          *(void **)(piVar2 + 2) = pvVar4;
          *piVar2 = iVar5;
        }
        *(undefined4 *)(in_RDI + 6) = 0;
        while( true ) {
          pBuf = (Fts5Buffer *)0x7fffffffffffffff;
          local_2c = 0;
          for (local_1c = 0; local_1c < iVar6; local_1c = local_1c + 1) {
            in_stack_ffffffffffffff88 = (i64 *)(*(long *)(piVar2 + 10) + (long)local_1c * 0x20);
            if ((*(char *)((long)in_stack_ffffffffffffff88 + 0x11) == '\0') &&
               (in_stack_ffffffffffffff88[3] < (long)pBuf)) {
              pBuf = (Fts5Buffer *)in_stack_ffffffffffffff88[3];
              local_2c = local_1c;
            }
          }
          if (pBuf == (Fts5Buffer *)0x7fffffffffffffff) break;
          sqlite3Fts5PoslistSafeAppend(pBuf,in_stack_ffffffffffffff88,0x2700f0);
          sqlite3Fts5PoslistReaderNext((Fts5PoslistReader *)0x27010a);
          if (iVar7 == 0) {
            *(Fts5Buffer **)(*(long *)(piVar2 + 2) + (long)piVar2[1] * 0x18 + 8) = pBuf;
            *(undefined4 *)(*(long *)(piVar2 + 2) + (long)piVar2[1] * 0x18 + 0x10) =
                 *(undefined4 *)(*(long *)(piVar2 + 0xc) + (long)local_2c * 4);
            *(Fts5Config **)(*(long *)(piVar2 + 2) + (long)piVar2[1] * 0x18) = local_28;
            piVar2[1] = piVar2[1] + 1;
          }
        }
        in_RDI[1] = in_RDI[5];
        *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(in_RDI + 6);
      }
    }
  }
LAB_002701ba:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5IterSetOutputsTokendata(Fts5Iter *pIter){
  int ii;
  int nHit = 0;
  i64 iRowid = SMALLEST_INT64;
  int iMin = 0;

  Fts5TokenDataIter *pT = pIter->pTokenDataIter;

  pIter->base.nData = 0;
  pIter->base.pData = 0;

  for(ii=0; ii<pT->nIter; ii++){
    Fts5Iter *p = pT->apIter[ii];
    if( p->base.bEof==0 ){
      if( nHit==0 || p->base.iRowid<iRowid ){
        iRowid = p->base.iRowid;
        nHit = 1;
        pIter->base.pData = p->base.pData;
        pIter->base.nData = p->base.nData;
        iMin = ii;
      }else if( p->base.iRowid==iRowid ){
        nHit++;
      }
    }
  }

  if( nHit==0 ){
    pIter->base.bEof = 1;
  }else{
    int eDetail = pIter->pIndex->pConfig->eDetail;
    pIter->base.bEof = 0;
    pIter->base.iRowid = iRowid;

    if( nHit==1 && eDetail==FTS5_DETAIL_FULL ){
      fts5TokendataIterAppendMap(pIter->pIndex, pT, iMin, 0, iRowid, -1);
    }else
    if( nHit>1 && eDetail!=FTS5_DETAIL_NONE ){
      int nReader = 0;
      int nByte = 0;
      i64 iPrev = 0;

      /* Allocate array of iterators if they are not already allocated. */
      if( pT->aPoslistReader==0 ){
        pT->aPoslistReader = (Fts5PoslistReader*)sqlite3Fts5MallocZero(
            &pIter->pIndex->rc,
            pT->nIter * (sizeof(Fts5PoslistReader) + sizeof(int))
        );
        if( pT->aPoslistReader==0 ) return;
        pT->aPoslistToIter = (int*)&pT->aPoslistReader[pT->nIter];
      }

      /* Populate an iterator for each poslist that will be merged */
      for(ii=0; ii<pT->nIter; ii++){
        Fts5Iter *p = pT->apIter[ii];
        if( iRowid==p->base.iRowid ){
          pT->aPoslistToIter[nReader] = ii;
          sqlite3Fts5PoslistReaderInit(
              p->base.pData, p->base.nData, &pT->aPoslistReader[nReader++]
          );
          nByte += p->base.nData;
        }
      }

      /* Ensure the output buffer is large enough */
      if( fts5BufferGrow(&pIter->pIndex->rc, &pIter->poslist, nByte+nHit*10) ){
        return;
      }

      /* Ensure the token-mapping is large enough */
      if( eDetail==FTS5_DETAIL_FULL && pT->nMapAlloc<(pT->nMap + nByte) ){
        int nNew = (pT->nMapAlloc + nByte) * 2;
        Fts5TokenDataMap *aNew = (Fts5TokenDataMap*)sqlite3_realloc(
            pT->aMap, nNew*sizeof(Fts5TokenDataMap)
        );
        if( aNew==0 ){
          pIter->pIndex->rc = SQLITE_NOMEM;
          return;
        }
        pT->aMap = aNew;
        pT->nMapAlloc = nNew;
      }

      pIter->poslist.n = 0;

      while( 1 ){
        i64 iMinPos = LARGEST_INT64;

        /* Find smallest position */
        iMin = 0;
        for(ii=0; ii<nReader; ii++){
          Fts5PoslistReader *pReader = &pT->aPoslistReader[ii];
          if( pReader->bEof==0 ){
            if( pReader->iPos<iMinPos ){
              iMinPos = pReader->iPos;
              iMin = ii;
            }
          }
        }

        /* If all readers were at EOF, break out of the loop. */
        if( iMinPos==LARGEST_INT64 ) break;

        sqlite3Fts5PoslistSafeAppend(&pIter->poslist, &iPrev, iMinPos);
        sqlite3Fts5PoslistReaderNext(&pT->aPoslistReader[iMin]);

        if( eDetail==FTS5_DETAIL_FULL ){
          pT->aMap[pT->nMap].iPos = iMinPos;
          pT->aMap[pT->nMap].iIter = pT->aPoslistToIter[iMin];
          pT->aMap[pT->nMap].iRowid = iRowid;
          pT->nMap++;
        }
      }

      pIter->base.pData = pIter->poslist.p;
      pIter->base.nData = pIter->poslist.n;
    }
  }
}